

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O2

void __thiscall simple_json::Stream::emit_json_key_value(Stream *this,string *key,string *value)

{
  emit_json_key(this,key);
  statement_inner<char_const(&)[2],std::__cxx11::string_const&,char_const(&)[2]>
            (this,(char (*) [2])0x37f7f2,value,(char (*) [2])0x37f7f2);
  return;
}

Assistant:

void Stream::emit_json_key_value(const std::string &key, const std::string &value)
{
	emit_json_key(key);
	statement_inner("\"", value, "\"");
}